

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O1

boolean autopickup_match(obj *obj)

{
  nh_bucstatus nVar1;
  boolean bVar2;
  nh_bucstatus nVar3;
  char *pcVar4;
  int iVar5;
  nh_autopickup_rule *patrn;
  
  nVar3 = B_UNKNOWN;
  if (iflags.ap_rules != (nh_autopickup_rules *)0x0) {
    pcVar4 = doname_price(obj);
    pcVar4 = makesingular(pcVar4);
    nVar1 = *(nh_bucstatus *)&obj->field_0x4a;
    if (((nVar1 & 0x40) != B_UNKNOWN) && (nVar3 = B_BLESSED, (nVar1 & B_UNCURSED) == B_UNKNOWN)) {
      nVar3 = nVar1 & B_BLESSED | B_UNCURSED;
    }
    iVar5 = 0;
    if (0 < (iflags.ap_rules)->num_rules) {
      patrn = (iflags.ap_rules)->rules;
      do {
        if (patrn->pattern[0] == '\0') {
LAB_00214c2c:
          if (((patrn->oclass == 0x61) || (patrn->oclass == (int)""[obj->oclass])) &&
             ((patrn->buc == B_DONT_CARE || (patrn->buc == nVar3)))) {
            nVar3 = (nh_bucstatus)(patrn->action == AP_GRAB);
            goto LAB_00214c74;
          }
        }
        else {
          bVar2 = pmatch(patrn->pattern,pcVar4);
          if (bVar2 != '\0') goto LAB_00214c2c;
        }
        iVar5 = iVar5 + 1;
        patrn = patrn + 1;
      } while (iVar5 < (iflags.ap_rules)->num_rules);
    }
    nVar3 = B_UNKNOWN;
  }
LAB_00214c74:
  return (boolean)nVar3;
}

Assistant:

static boolean autopickup_match(struct obj *obj)
{
	int i;
	struct nh_autopickup_rule *r;
	char *objdesc;
	enum nh_bucstatus objbuc;
	
	if (!iflags.ap_rules)
	    return FALSE;
	
	objdesc = makesingular(doname_price(obj));
	if (obj->bknown) {
	    if (obj->blessed)
		objbuc = B_BLESSED;
	    else if (obj->cursed)
		objbuc = B_CURSED;
	    else
		objbuc = B_UNCURSED;
	} else
	    objbuc = B_UNKNOWN;
	
	/* test the aotupickup rules in order. If any of the rules matches this
	 * object, return the result */
	r = &iflags.ap_rules->rules[0];
	for (i = 0; i < iflags.ap_rules->num_rules; i++, r++) {
	    if ((!strlen(r->pattern) || pmatch(r->pattern, objdesc)) &&
		(r->oclass == OCLASS_ANY || r->oclass == def_oc_syms[(int)obj->oclass]) &&
		(r->buc == B_DONT_CARE || r->buc == objbuc))
		return r->action == AP_GRAB;
	}
	return FALSE;
}